

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTraits.h
# Opt level: O3

string_view slang::typeName<std::__cxx11::string>(void)

{
  size_type sVar1;
  size_type sVar2;
  ulong uVar3;
  ulong uVar4;
  string_view sVar5;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  local_38._M_len = 0x3c;
  local_38._M_str = "std::string_view slang::detail::wrappedTypeName() [T = void]";
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_38,"void",0,4);
  local_38._M_len = 0x3c;
  local_38._M_str = "std::string_view slang::detail::wrappedTypeName() [T = void]";
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_38,"void",0,4);
  if (sVar1 < 0x50) {
    uVar3 = (sVar2 - sVar1) + 0x17;
    uVar4 = 0x4f - sVar1;
    if (uVar3 <= 0x4f - sVar1) {
      uVar4 = uVar3;
    }
    sVar5._M_str = "std::string_view slang::detail::wrappedTypeName() [T = std::basic_string<char>]"
                   + sVar1;
    sVar5._M_len = uVar4;
    return sVar5;
  }
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",sVar1,
             0x4f);
}

Assistant:

constexpr std::string_view typeName() {
    // https://stackoverflow.com/questions/81870/is-it-possible-to-print-a-variables-type-in-standard-c/64490578#64490578
    auto name = detail::wrappedTypeName<T>();
    auto prefixLength = detail::wrappedTypeNamePrefixLength();
    auto suffixLength = detail::wrappedTypeNameSuffixLength();
    return name.substr(prefixLength, name.length() - prefixLength - suffixLength);
}